

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

bool testBash(void)

{
  bool bVar1;
  BFunc<3UL> bf;
  MP<6UL,_GF2::MOGrevlex<6UL>_> local_1a8;
  MM<6UL> local_188;
  MI<6UL,_GF2::MOGrevlex<6UL>_> i;
  MP<3UL,_GF2::MOGrevlex<6UL>_> p;
  Buchb<6UL,_GF2::MOGrevlex<6UL>,_GF2::CritPair<6UL,_GF2::MOGrevlex<6UL>_>_> bb;
  VSubst<3UL> s;
  word s_table [8];
  
  s_table[6] = 5;
  s_table[7] = 0;
  s_table[4] = 6;
  s_table[5] = 7;
  s_table[2] = 3;
  s_table[3] = 4;
  s_table[0] = 1;
  s_table[1] = 2;
  GF2::VFunc<3UL,_3UL>::VFunc(&s.super_VFunc<3UL,_3UL>,s_table);
  i.
  super_list<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
  .
  super__List_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&i;
  i.
  super_list<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
  .
  super__List_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
  ._M_impl._M_node._M_size = 0;
  p.super_list<GF2::MM<3UL>,_std::allocator<GF2::MM<3UL>_>_>.
  super__List_base<GF2::MM<3UL>,_std::allocator<GF2::MM<3UL>_>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&p;
  p.super_list<GF2::MM<3UL>,_std::allocator<GF2::MM<3UL>_>_>.
  super__List_base<GF2::MM<3UL>,_std::allocator<GF2::MM<3UL>_>_>._M_impl._M_node._M_size = 0;
  i.
  super_list<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
  .
  super__List_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       i.
       super_list<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
       .
       super__List_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  p.super_list<GF2::MM<3UL>,_std::allocator<GF2::MM<3UL>_>_>.
  super__List_base<GF2::MM<3UL>,_std::allocator<GF2::MM<3UL>_>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       p.super_list<GF2::MM<3UL>,_std::allocator<GF2::MM<3UL>_>_>.
       super__List_base<GF2::MM<3UL>,_std::allocator<GF2::MM<3UL>_>_>._M_impl._M_node.
       super__List_node_base._M_next;
  GF2::BFunc<3UL>::BFunc(&bf,false);
  GF2::VFunc<3UL,_3UL>::GetCoord(&s.super_VFunc<3UL,_3UL>,0,&bf);
  GF2::BFunc<3ul>::To<GF2::MOGrevlex<6ul>>((BFunc<3ul> *)&bf,&p);
  GF2::MP<6ul,GF2::MOGrevlex<6ul>>::MP<3ul,GF2::MOGrevlex<6ul>>
            ((MP<6ul,GF2::MOGrevlex<6ul>> *)&local_1a8,&p);
  local_188.super_WW<6UL>._words[0] = (WW<6UL>)(word  [1])0x8;
  GF2::operator+((MP<6UL,_GF2::MOGrevlex<6UL>_> *)&bb,&local_1a8,&local_188);
  GF2::MI<6ul,GF2::MOGrevlex<6ul>>::Insert<6ul,GF2::MOGrevlex<6ul>>
            ((MI<6ul,GF2::MOGrevlex<6ul>> *)&i,(MP<6UL,_GF2::MOGrevlex<6UL>_> *)&bb);
  std::__cxx11::_List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::_M_clear
            ((_List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)&bb);
  std::__cxx11::_List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::_M_clear
            ((_List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)&local_1a8);
  GF2::VFunc<3UL,_3UL>::GetCoord(&s.super_VFunc<3UL,_3UL>,1,&bf);
  GF2::BFunc<3ul>::To<GF2::MOGrevlex<6ul>>((BFunc<3ul> *)&bf,&p);
  GF2::MP<6ul,GF2::MOGrevlex<6ul>>::MP<3ul,GF2::MOGrevlex<6ul>>
            ((MP<6ul,GF2::MOGrevlex<6ul>> *)&local_1a8,&p);
  local_188.super_WW<6UL>._words[0] = (WW<6UL>)(word  [1])0x10;
  GF2::operator+((MP<6UL,_GF2::MOGrevlex<6UL>_> *)&bb,&local_1a8,&local_188);
  GF2::MI<6ul,GF2::MOGrevlex<6ul>>::Insert<6ul,GF2::MOGrevlex<6ul>>
            ((MI<6ul,GF2::MOGrevlex<6ul>> *)&i,(MP<6UL,_GF2::MOGrevlex<6UL>_> *)&bb);
  std::__cxx11::_List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::_M_clear
            ((_List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)&bb);
  std::__cxx11::_List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::_M_clear
            ((_List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)&local_1a8);
  GF2::VFunc<3UL,_3UL>::GetCoord(&s.super_VFunc<3UL,_3UL>,2,&bf);
  GF2::BFunc<3ul>::To<GF2::MOGrevlex<6ul>>((BFunc<3ul> *)&bf,&p);
  GF2::MP<6ul,GF2::MOGrevlex<6ul>>::MP<3ul,GF2::MOGrevlex<6ul>>
            ((MP<6ul,GF2::MOGrevlex<6ul>> *)&local_1a8,&p);
  local_188.super_WW<6UL>._words[0] = (WW<6UL>)(word  [1])0x20;
  GF2::operator+((MP<6UL,_GF2::MOGrevlex<6UL>_> *)&bb,&local_1a8,&local_188);
  GF2::MI<6ul,GF2::MOGrevlex<6ul>>::Insert<6ul,GF2::MOGrevlex<6ul>>
            ((MI<6ul,GF2::MOGrevlex<6ul>> *)&i,(MP<6UL,_GF2::MOGrevlex<6UL>_> *)&bb);
  std::__cxx11::_List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::_M_clear
            ((_List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)&bb);
  std::__cxx11::_List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::_M_clear
            ((_List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)&local_1a8);
  bb._vptr_Buchb = (_func_int **)&PTR_ValidatePre_0015ed40;
  bb._basis.
  super_list<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
  .
  super__List_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&bb._basis;
  bb._basis.
  super_list<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
  .
  super__List_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
  ._M_impl._M_node._M_size = 0;
  bb._reserve.
  super_list<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
  .
  super__List_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&bb._reserve;
  bb._reserve.
  super_list<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
  .
  super__List_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
  ._M_impl._M_node._M_size = 0;
  bb._pairs.
  super__List_base<GF2::CritPair<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::CritPair<6UL,_GF2::MOGrevlex<6UL>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&bb._pairs;
  bb._pairs.
  super__List_base<GF2::CritPair<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::CritPair<6UL,_GF2::MOGrevlex<6UL>_>_>_>
  ._M_impl._M_node._M_size = 0;
  bb._pairs_processed.
  super__List_base<GF2::CritPair<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::CritPair<6UL,_GF2::MOGrevlex<6UL>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&bb._pairs_processed;
  bb._pairs_processed.
  super__List_base<GF2::CritPair<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::CritPair<6UL,_GF2::MOGrevlex<6UL>_>_>_>
  ._M_impl._M_node._M_size = 0;
  bb._stat.pairs_processed = 0;
  bb._stat.reduction_to_zero = 0;
  bb._stat.max_deg = 0;
  bb._stat._20_4_ = 0;
  bb._stat.a_criterion = 0;
  bb._stat.b_criterion = 0;
  bb._stat.c_criterion = 0;
  bb._stat.buch_criterion = 0;
  bb._stat.r_criterion = 0;
  bb._basis.
  super_list<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
  .
  super__List_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       bb._basis.
       super_list<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
       .
       super__List_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  bb._reserve.
  super_list<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
  .
  super__List_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       bb._reserve.
       super_list<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
       .
       super__List_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  bb._pairs.
  super__List_base<GF2::CritPair<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::CritPair<6UL,_GF2::MOGrevlex<6UL>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       bb._pairs.
       super__List_base<GF2::CritPair<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::CritPair<6UL,_GF2::MOGrevlex<6UL>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  bb._pairs_processed.
  super__List_base<GF2::CritPair<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::CritPair<6UL,_GF2::MOGrevlex<6UL>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       bb._pairs_processed.
       super__List_base<GF2::CritPair<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::CritPair<6UL,_GF2::MOGrevlex<6UL>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  GF2::Buchb<6UL,_GF2::MOGrevlex<6UL>,_GF2::CritPair<6UL,_GF2::MOGrevlex<6UL>_>_>::Init(&bb);
  GF2::Buchb<6ul,GF2::MOGrevlex<6ul>,GF2::CritPair<6ul,GF2::MOGrevlex<6ul>>>::
  Update<GF2::MOGrevlex<6ul>>
            ((Buchb<6ul,GF2::MOGrevlex<6ul>,GF2::CritPair<6ul,GF2::MOGrevlex<6ul>>> *)&bb,&i);
  GF2::Buchb<6UL,_GF2::MOGrevlex<6UL>,_GF2::CritPair<6UL,_GF2::MOGrevlex<6UL>_>_>::Process(&bb);
  GF2::Buchb<6UL,_GF2::MOGrevlex<6UL>,_GF2::CritPair<6UL,_GF2::MOGrevlex<6UL>_>_>::Done(&bb,&i);
  if (i.
      super_list<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
      .
      super__List_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
      ._M_impl._M_node._M_size == 0xe) {
    GF2::MI<6UL,_GF2::MOGrevlex<6UL>_>::QuotientBasisDim
              ((MI<6UL,_GF2::MOGrevlex<6UL>_> *)&local_1a8);
    bVar1 = local_1a8.super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>.
            super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>._M_impl._M_node.
            super__List_node_base._M_next == (_List_node_base *)0x8;
  }
  else {
    bVar1 = false;
  }
  GF2::Buchb<6UL,_GF2::MOGrevlex<6UL>,_GF2::CritPair<6UL,_GF2::MOGrevlex<6UL>_>_>::~Buchb(&bb);
  std::__cxx11::_List_base<GF2::MM<3UL>,_std::allocator<GF2::MM<3UL>_>_>::_M_clear
            ((_List_base<GF2::MM<3UL>,_std::allocator<GF2::MM<3UL>_>_> *)&p);
  std::__cxx11::
  _List_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
  ::_M_clear((_List_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
              *)&i);
  return bVar1;
}

Assistant:

bool testBash()
{
	typedef MOGrevlex<6> O;
	typedef MM<6> X;
	// S-блок и его идеал
	const word s_table[] = {1, 2, 3, 4, 6, 7, 5, 0};
	VSubst<3> s(s_table);
	MI<6, O> i;
	// i <- {x_{k + 3} - s_k(x_0, s_1, x_2): k = 0, 1, 2}
	MP<3, O> p;
	BFunc<3> bf;
	s.GetCoord(0, bf);
	bf.To(p);
	i.Insert(MP<6, O>(p) + X(3));
	s.GetCoord(1, bf);
	bf.To(p);
	i.Insert(MP<6, O>(p) + X(4));
	s.GetCoord(2, bf);
	bf.To(p);
	i.Insert(MP<6, O>(p) + X(5));
	// базис Гребнера
	Buchb<6, O> bb;
	bb.Init();
	bb.Update(i);
	bb.Process();
	bb.Done(i);
	// завершение
	return i.Size() == 14 && i.QuotientBasisDim() == word(8);
}